

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ControllerBlogPost.cpp
# Opt level: O2

string * __thiscall
Angelsen::ControllerBlogPost::get
          (string *__return_storage_ptr__,ControllerBlogPost *this,string *blogPath)

{
  string *psVar1;
  Template t;
  WebFile blog;
  allocator<char> local_141;
  string local_140;
  string local_120;
  string local_100;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e0;
  Template local_c0;
  WebFile local_68;
  
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_c0,
                 &this->config_->templateDir,"/");
  std::operator+(&local_e0,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_c0,
                 blogPath);
  EasyWeb::WebFile::WebFile(&local_68,&local_e0,false);
  std::__cxx11::string::~string((string *)&local_e0);
  std::__cxx11::string::~string((string *)&local_c0);
  psVar1 = EasyWeb::WebFile::file_abi_cxx11_
                     ((this->config_->template_)._M_t.
                      super___uniq_ptr_impl<EasyWeb::WebFile,_std::default_delete<EasyWeb::WebFile>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_EasyWeb::WebFile_*,_std::default_delete<EasyWeb::WebFile>_>
                      .super__Head_base<0UL,_EasyWeb::WebFile_*,_false>._M_head_impl);
  std::__cxx11::string::string((string *)&local_100,(string *)psVar1);
  Jinja2CppLight::Template::Template(&local_c0,&local_100);
  std::__cxx11::string::~string((string *)&local_100);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_120,"body",&local_141);
  psVar1 = EasyWeb::WebFile::file_abi_cxx11_(&local_68);
  std::__cxx11::string::string((string *)&local_140,(string *)psVar1);
  Jinja2CppLight::Template::setValue(&local_c0,&local_120,&local_140);
  std::__cxx11::string::~string((string *)&local_140);
  std::__cxx11::string::~string((string *)&local_120);
  Jinja2CppLight::Template::render_abi_cxx11_(__return_storage_ptr__,&local_c0);
  Jinja2CppLight::Template::~Template(&local_c0);
  EasyWeb::WebFile::~WebFile(&local_68);
  return __return_storage_ptr__;
}

Assistant:

std::string ControllerBlogPost::get(const std::string& blogPath)
{
    EasyWeb::WebFile blog(config_.templateDir + "/" + blogPath, false);

    Jinja2CppLight::Template t(config_.template_->file());
    t.setValue("body", blog.file());

    return t.render();
}